

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CGameConsole::OnRender(CGameConsole *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  CUIRect *pCVar6;
  CConfig *pCVar7;
  IInput *pIVar8;
  IGraphics *pIVar9;
  CInstance *pCVar10;
  IClient *pIVar11;
  ITextRender *pIVar12;
  CTextCursor *pCVar13;
  char *pcVar14;
  CGameConsole *in_RDI;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  vec2 vVar19;
  int Page;
  int TotalPages;
  float LineOffset;
  float OffsetY;
  CBacklogEntry *pEntry;
  float Delta;
  CTextCursor *pInputCursor;
  char *pPrompt;
  float y;
  float x;
  float RowHeight;
  float FontSize;
  CInstance *pConsole;
  float ConsoleHeightScale;
  float Progress;
  float Now;
  float ConsoleHeight;
  float ConsoleMaxHeight;
  CCompletionOptionRenderInfo Info;
  CQuadItem QuadItem;
  CUIRect Screen;
  char aBuf [128];
  char aBuf_1 [512];
  CColorVertex Array [4];
  float in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb7c;
  TStaticRingBuffer<CGameConsole::CInstance::CBacklogEntry,_65536,_1> *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  float in_stack_fffffffffffffb8c;
  CGameConsole *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  uint uVar20;
  byte local_441;
  int local_438;
  int local_434;
  float local_42c;
  CBacklogEntry *local_428;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_410;
  char *local_408;
  undefined1 local_3b8 [8];
  CTextCursor *local_3b0;
  char *local_3a8;
  int local_3a0;
  int local_39c;
  float local_398;
  float *local_390;
  float local_388;
  float local_384;
  CQuadItem local_380;
  uint local_370;
  CQuadItem local_36c;
  CColorVertex local_35c;
  CColorVertex local_348;
  CColorVertex local_334;
  CColorVertex local_320;
  CQuadItem local_30c;
  uint local_2fc;
  CQuadItem local_2f8;
  undefined8 local_2e8;
  undefined8 local_2e0;
  CTextCursor local_2d8;
  char local_258 [512];
  CColorVertex local_58;
  CColorVertex local_44;
  CColorVertex local_30;
  CColorVertex local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CComponent::UI((CComponent *)0x156626);
  pCVar6 = CUI::Screen((CUI *)in_stack_fffffffffffffb80);
  local_2e8._0_4_ = pCVar6->x;
  local_2e8._4_4_ = pCVar6->y;
  local_2e0._0_4_ = pCVar6->w;
  local_2e0._4_4_ = pCVar6->h;
  fVar15 = ((float)local_2e0._4_4_ * 3.0) / 5.0;
  fVar16 = TimeNow(in_stack_fffffffffffffb90);
  fVar17 = (fVar16 - (in_RDI->m_StateChangeEnd - in_RDI->m_StateChangeDuration)) /
           in_RDI->m_StateChangeDuration;
  if (1.0 <= fVar17) {
    if (in_RDI->m_ConsoleState == 3) {
      in_RDI->m_ConsoleState = 0;
      CurrentConsole(in_RDI);
      CLineInput::Deactivate((CLineInput *)0x1566f8);
    }
    else if (in_RDI->m_ConsoleState == 1) {
      in_RDI->m_ConsoleState = 2;
      CurrentConsole(in_RDI);
      CLineInput::Activate
                ((CLineInput *)in_stack_fffffffffffffb80,(EInputPriority)in_stack_fffffffffffffb7c);
    }
    fVar17 = 1.0;
  }
  if ((in_RDI->m_ConsoleState == 2) &&
     (pCVar7 = CComponent::Config((CComponent *)0x15675b), pCVar7->m_ClEditor != 0)) {
    Toggle(in_stack_fffffffffffffb90,(int)in_stack_fffffffffffffb8c);
  }
  if (in_RDI->m_ConsoleState == 0) goto LAB_00157d53;
  if (in_RDI->m_ConsoleState == 2) {
    pIVar8 = CComponent::Input((CComponent *)0x15679b);
    (*(pIVar8->super_IInterface)._vptr_IInterface[10])();
  }
  if (in_RDI->m_ConsoleState == 1) {
    fVar18 = ConsoleScaleFunc(0.0);
  }
  else if (in_RDI->m_ConsoleState == 3) {
    fVar18 = ConsoleScaleFunc(0.0);
  }
  else {
    fVar18 = ConsoleScaleFunc(0.0);
  }
  fVar18 = fVar18 * fVar15;
  pIVar9 = CComponent::Graphics((CComponent *)0x156837);
  (*(pIVar9->super_IInterface)._vptr_IInterface[5])();
  CComponent::Graphics((CComponent *)0x15686e);
  IGraphics::TextureClear((IGraphics *)in_stack_fffffffffffffb80);
  pIVar9 = CComponent::Graphics((CComponent *)0x156880);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
  IGraphics::CColorVertex::CColorVertex(&local_58,0,0.0,0.0,0.0,0.5);
  IGraphics::CColorVertex::CColorVertex(&local_44,1,0.0,0.0,0.0,0.5);
  IGraphics::CColorVertex::CColorVertex(&local_30,2,0.0,0.0,0.0,0.0);
  IGraphics::CColorVertex::CColorVertex(&local_1c,3,0.0,0.0,0.0,0.0);
  pIVar9 = CComponent::Graphics((CComponent *)0x156921);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x20])(pIVar9,&local_58,4);
  IGraphics::CQuadItem::CQuadItem(&local_2f8,0.0,fVar18,(float)local_2e0,10.0);
  pIVar9 = CComponent::Graphics((CComponent *)0x15696e);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&local_2f8,1);
  pIVar9 = CComponent::Graphics((CComponent *)0x156991);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
  pIVar9 = CComponent::Graphics((CComponent *)0x1569a7);
  local_2fc = g_pData->m_aImages[9].m_Id.m_Id;
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x13])(pIVar9,(ulong)local_2fc);
  pIVar9 = CComponent::Graphics((CComponent *)0x1569df);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
  pIVar9 = CComponent::Graphics((CComponent *)0x1569f5);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x21])();
  if (in_RDI->m_ConsoleType == 1) {
    pIVar9 = CComponent::Graphics((CComponent *)0x156a2f);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x21])();
  }
  pIVar9 = CComponent::Graphics((CComponent *)0x156a60);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1a])(pIVar9,0xffffffff);
  IGraphics::CQuadItem::CQuadItem(&local_30c,0.0,0.0,(float)local_2e0,fVar18);
  local_2f8.m_X = local_30c.m_X;
  local_2f8.m_Y = local_30c.m_Y;
  local_2f8.m_Width = local_30c.m_Width;
  local_2f8.m_Height = local_30c.m_Height;
  pIVar9 = CComponent::Graphics((CComponent *)0x156b05);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&local_2f8,1);
  pIVar9 = CComponent::Graphics((CComponent *)0x156b28);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
  CComponent::Graphics((CComponent *)0x156b3e);
  IGraphics::TextureClear((IGraphics *)in_stack_fffffffffffffb80);
  pIVar9 = CComponent::Graphics((CComponent *)0x156b50);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
  IGraphics::CColorVertex::CColorVertex(&local_320,0,0.0,0.0,0.0,0.0);
  local_58.m_Index = local_320.m_Index;
  local_58.m_R = local_320.m_R;
  local_58.m_G = local_320.m_G;
  local_58.m_B = local_320.m_B;
  local_58.m_A = local_320.m_A;
  IGraphics::CColorVertex::CColorVertex(&local_334,1,0.0,0.0,0.0,0.0);
  local_44.m_Index = local_334.m_Index;
  local_44.m_R = local_334.m_R;
  local_44.m_G = local_334.m_G;
  local_44.m_B = local_334.m_B;
  local_44.m_A = local_334.m_A;
  IGraphics::CColorVertex::CColorVertex(&local_348,2,0.0,0.0,0.0,0.25);
  local_30.m_Index = local_348.m_Index;
  local_30.m_R = local_348.m_R;
  local_30.m_G = local_348.m_G;
  local_30.m_B = local_348.m_B;
  local_30.m_A = local_348.m_A;
  IGraphics::CColorVertex::CColorVertex(&local_35c,3,0.0,0.0,0.0,0.25);
  local_1c.m_Index = local_35c.m_Index;
  local_1c.m_R = local_35c.m_R;
  local_1c.m_G = local_35c.m_G;
  local_1c.m_B = local_35c.m_B;
  local_1c.m_A = local_35c.m_A;
  pIVar9 = CComponent::Graphics((CComponent *)0x156c9d);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x20])(pIVar9,&local_58,4);
  IGraphics::CQuadItem::CQuadItem(&local_36c,0.0,fVar18 - 20.0,(float)local_2e0,10.0);
  local_2f8.m_X = local_36c.m_X;
  local_2f8.m_Y = local_36c.m_Y;
  local_2f8.m_Width = local_36c.m_Width;
  local_2f8.m_Height = local_36c.m_Height;
  pIVar9 = CComponent::Graphics((CComponent *)0x156d16);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&local_2f8,1);
  pIVar9 = CComponent::Graphics((CComponent *)0x156d39);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
  pIVar9 = CComponent::Graphics((CComponent *)0x156d4f);
  local_370 = g_pData->m_aImages[10].m_Id.m_Id;
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x13])(pIVar9,(ulong)local_370);
  pIVar9 = CComponent::Graphics((CComponent *)0x156d87);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
  pIVar9 = CComponent::Graphics((CComponent *)0x156d9d);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x21])();
  pIVar9 = CComponent::Graphics((CComponent *)0x156dc9);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1a])(pIVar9,0xffffffff);
  IGraphics::CQuadItem::CQuadItem(&local_380,0.0,fVar18 - 10.0,(float)local_2e0,10.0);
  local_2f8.m_X = local_380.m_X;
  local_2f8.m_Y = local_380.m_Y;
  local_2f8.m_Width = local_380.m_Width;
  local_2f8.m_Height = local_380.m_Height;
  pIVar9 = CComponent::Graphics((CComponent *)0x156e5e);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&local_2f8,1);
  pIVar9 = CComponent::Graphics((CComponent *)0x156e81);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
  fVar18 = fVar18 - 22.0;
  pCVar10 = CurrentConsole(in_RDI);
  if ((OnRender()::s_InfoCursor == '\0') &&
     (iVar2 = __cxa_guard_acquire(&OnRender()::s_InfoCursor), iVar2 != 0)) {
    CTextCursor::CTextCursor((CTextCursor *)in_stack_fffffffffffffb90);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_InfoCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_InfoCursor);
  }
  CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffb80,
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  CTextCursor::MoveTo((CTextCursor *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                      in_stack_fffffffffffffb78);
  OnRender::s_InfoCursor.m_FontSize = 10.0;
  OnRender::s_InfoCursor.m_MaxWidth = -1.0;
  if ((OnRender()::s_PromptCursor == '\0') &&
     (iVar2 = __cxa_guard_acquire(&OnRender()::s_PromptCursor), iVar2 != 0)) {
    CTextCursor::CTextCursor
              ((CTextCursor *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (float)((ulong)in_stack_fffffffffffffb98 >> 0x20),(int)in_stack_fffffffffffffb98);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_PromptCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_PromptCursor);
  }
  CTextCursor::MoveTo((CTextCursor *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                      in_stack_fffffffffffffb78);
  local_408 = "> ";
  if (in_RDI->m_ConsoleType == 1) {
    pIVar11 = CComponent::Client((CComponent *)0x157087);
    iVar2 = IClient::State(pIVar11);
    if (iVar2 != 3) {
      pIVar11 = CComponent::Client((CComponent *)0x15709e);
      iVar2 = IClient::State(pIVar11);
      if (iVar2 != 2) {
        local_408 = "NOT CONNECTED> ";
        goto LAB_00157150;
      }
    }
    pIVar11 = CComponent::Client((CComponent *)0x1570b9);
    uVar3 = (*(pIVar11->super_IInterface)._vptr_IInterface[0x1a])();
    if ((uVar3 & 1) == 0) {
      local_408 = "ENTER PASSWORD> ";
    }
    else {
      local_408 = "rcon> ";
    }
  }
LAB_00157150:
  CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffb80,
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  pIVar12 = CComponent::TextRender((CComponent *)0x157173);
  (*(pIVar12->super_IInterface)._vptr_IInterface[0xb])
            (pIVar12,&OnRender::s_PromptCursor,local_408,0xffffffff);
  vVar19 = CTextCursor::AdvancePosition
                     ((CTextCursor *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_410 = vVar19.field_0;
  local_441 = 0;
  if (in_RDI->m_ConsoleType == 1) {
    pIVar11 = CComponent::Client((CComponent *)0x1571e1);
    iVar2 = IClient::State(pIVar11);
    if (iVar2 != 3) {
      pIVar11 = CComponent::Client((CComponent *)0x1571f8);
      iVar2 = IClient::State(pIVar11);
      local_441 = 0;
      if (iVar2 != 2) goto LAB_00157229;
    }
    pIVar11 = CComponent::Client((CComponent *)0x157217);
    iVar2 = (*(pIVar11->super_IInterface)._vptr_IInterface[0x1a])();
    local_441 = (byte)iVar2 ^ 0xff;
  }
LAB_00157229:
  CLineInput::SetHidden(&pCVar10->m_Input,(bool)(local_441 & 1));
  pCVar13 = CLineInput::GetCursor(&pCVar10->m_Input);
  pCVar13->m_Align = 8;
  pCVar13->m_MaxLines = -1;
  pCVar13->m_FontSize = 10.0;
  pCVar13->m_MaxWidth = ((float)local_2e0 - 10.0) - local_410.x;
  CTextCursor::MoveTo((CTextCursor *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                      in_stack_fffffffffffffb78);
  CLineInput::Activate
            ((CLineInput *)in_stack_fffffffffffffb80,(EInputPriority)in_stack_fffffffffffffb7c);
  CLineInput::Render((CLineInput *)CONCAT44(fVar16,fVar17));
  iVar2 = CTextCursor::LineCount(pCVar13);
  if ((OnRender()::s_LastRender == '\0') &&
     (iVar4 = __cxa_guard_acquire(&OnRender()::s_LastRender), iVar4 != 0)) {
    OnRender::s_LastRender = fVar16;
    __cxa_guard_release(&OnRender()::s_LastRender);
  }
  if (in_RDI->m_ConsoleType == 0) {
LAB_001573b0:
    pcVar14 = CLineInput::GetString(&pCVar10->m_Input);
    if (*pcVar14 != '\0') {
      local_3a0 = pCVar10->m_CompletionChosen;
      local_39c = 0;
      local_398 = pCVar10->m_CompletionRenderOffset;
      local_390 = &pCVar10->m_CompletionRenderOffsetChange;
      local_388 = (float)local_2e0;
      local_384 = 0.0;
      pcVar14 = pCVar10->m_aCompletionBuffer;
      local_3b0 = &OnRender::s_InfoCursor;
      in_stack_fffffffffffffb90 = (CGameConsole *)in_RDI->m_pConsole;
      uVar3 = pCVar10->m_CompletionFlagmask;
      uVar20 = 0;
      local_3a8 = pcVar14;
      if (in_RDI->m_ConsoleType != 0) {
        pIVar11 = CComponent::Client((CComponent *)0x1574ad);
        uVar5 = (*(pIVar11->super_IInterface)._vptr_IInterface[0x1a])();
        uVar20 = 0;
        if ((uVar5 & 1) != 0) {
          pIVar11 = CComponent::Client((CComponent *)0x1574d2);
          iVar4 = (*(pIVar11->super_IInterface)._vptr_IInterface[0x1b])();
          uVar20 = iVar4 << 0x18;
        }
      }
      (*(in_stack_fffffffffffffb90->super_CComponent)._vptr_CComponent[5])
                (in_stack_fffffffffffffb90,pcVar14,(ulong)uVar3,(ulong)(uVar20 >> 0x18 & 1),
                 PossibleCommandsRenderCallback,local_3b8);
      if ((local_39c < 1) && ((pCVar10->m_IsCommand & 1U) != 0)) {
        bVar1 = IsMapCommandPrefix((char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                    in_stack_fffffffffffffb78));
        if (bVar1) {
          local_3a0 = pCVar10->m_CompletionMapChosen;
          local_39c = 0;
          local_384 = 0.0;
          local_3a8 = pCVar10->m_aCompletionMapBuffer;
          (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[6])
                    (in_RDI->m_pConsole,local_3a8,PossibleCommandsRenderCallback,local_3b8);
        }
        if ((local_39c < 1) && ((pCVar10->m_IsCommand & 1U) != 0)) {
          str_format(local_258,0x200,"Help: %s ",pCVar10->m_aCommandHelp);
          pIVar12 = CComponent::TextRender((CComponent *)0x157608);
          (*(pIVar12->super_IInterface)._vptr_IInterface[7])(pIVar12,local_3b0,local_258,0xffffffff)
          ;
          pIVar12 = CComponent::TextRender((CComponent *)0x157630);
          (*(pIVar12->super_IInterface)._vptr_IInterface[4])();
          str_format(local_258,0x200,"Syntax: %s %s",pCVar10->m_aCommandName,
                     pCVar10->m_aCommandParams);
          pIVar12 = CComponent::TextRender((CComponent *)0x157692);
          (*(pIVar12->super_IInterface)._vptr_IInterface[7])(pIVar12,local_3b0,local_258,0xffffffff)
          ;
        }
      }
      fVar15 = absolute<float>(pCVar10->m_CompletionRenderOffsetChange);
      if (local_388 < fVar15) {
        pCVar10->m_CompletionRenderOffset =
             pCVar10->m_CompletionRenderOffsetChange + pCVar10->m_CompletionRenderOffset;
        pCVar10->m_CompletionRenderOffsetChange = 0.0;
      }
      if ((pCVar10->m_CompletionRenderOffsetChange != 0.0) ||
         (NAN(pCVar10->m_CompletionRenderOffsetChange))) {
        in_stack_fffffffffffffb8c = pCVar10->m_CompletionRenderOffsetChange;
        fVar15 = clamp<float>((fVar16 - OnRender::s_LastRender) * 10.0,0.0,1.0);
        pCVar10->m_CompletionRenderOffset =
             in_stack_fffffffffffffb8c * fVar15 + pCVar10->m_CompletionRenderOffset;
        pCVar10->m_CompletionRenderOffsetChange =
             pCVar10->m_CompletionRenderOffsetChange - in_stack_fffffffffffffb8c * fVar15;
      }
      if (0.0 < pCVar10->m_CompletionRenderOffset) {
        pCVar10->m_CompletionRenderOffset = 0.0;
        pCVar10->m_CompletionRenderOffsetChange = 0.0;
      }
      if ((local_388 < local_384) && (pCVar10->m_CompletionRenderOffset < local_388 - local_384)) {
        pCVar10->m_CompletionRenderOffset = local_388 - local_384;
        pCVar10->m_CompletionRenderOffsetChange = 0.0;
      }
    }
  }
  else {
    pIVar11 = CComponent::Client((CComponent *)0x15739b);
    uVar3 = (*(pIVar11->super_IInterface)._vptr_IInterface[0x1a])();
    if ((uVar3 & 1) != 0) goto LAB_001573b0;
  }
  OnRender::s_LastRender = fVar16;
  pIVar12 = CComponent::TextRender((CComponent *)0x15788b);
  (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
            (pIVar12,&OnRender::s_InfoCursor,0,0xffffffff);
  pIVar12 = CComponent::TextRender((CComponent *)0x1578b7);
  (*(pIVar12->super_IInterface)._vptr_IInterface[4])();
  if ((OnRender()::s_Cursor == '\0') &&
     (iVar4 = __cxa_guard_acquire(&OnRender()::s_Cursor), iVar4 != 0)) {
    CTextCursor::CTextCursor((CTextCursor *)in_stack_fffffffffffffb90);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_Cursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_Cursor);
  }
  CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffb80,
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  CTextCursor::MoveTo((CTextCursor *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                      in_stack_fffffffffffffb78);
  OnRender::s_Cursor.m_FontSize = 10.0;
  OnRender::s_Cursor.m_MaxLines = -1;
  OnRender::s_Cursor.m_MaxWidth = (float)local_2e0 - 10.0;
  local_428 = TStaticRingBuffer<CGameConsole::CInstance::CBacklogEntry,_65536,_1>::Last
                        ((TStaticRingBuffer<CGameConsole::CInstance::CBacklogEntry,_65536,_1> *)
                         0x157995);
  if ((OnRender()::s_LastActivePage == '\0') &&
     (iVar4 = __cxa_guard_acquire(&OnRender()::s_LastActivePage), iVar4 != 0)) {
    OnRender::s_LastActivePage = pCVar10->m_BacklogActPage;
    __cxa_guard_release(&OnRender()::s_LastActivePage);
  }
  local_434 = 1;
  for (local_438 = 0; local_42c = 0.0, local_438 <= OnRender::s_LastActivePage;
      local_438 = local_438 + 1) {
    while (local_428 != (CBacklogEntry *)0x0) {
      CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffb80,
                         CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      if ((local_428->m_Highlighted & 1U) != 0) {
        pIVar12 = CComponent::TextRender((CComponent *)0x157a41);
        (*(pIVar12->super_IInterface)._vptr_IInterface[4])();
      }
      pIVar12 = CComponent::TextRender((CComponent *)0x157a95);
      (*(pIVar12->super_IInterface)._vptr_IInterface[7])
                (pIVar12,&OnRender::s_Cursor,local_428->m_aText,0xffffffff);
      pIVar12 = CComponent::TextRender((CComponent *)0x157abd);
      (*(pIVar12->super_IInterface)._vptr_IInterface[4])();
      if (local_428->m_YOffset <= 0.0 && local_428->m_YOffset != 0.0) {
        fVar16 = CTextCursor::BaseLineY(&OnRender::s_Cursor);
        local_428->m_YOffset = fVar16 + 1.0;
      }
      local_42c = local_428->m_YOffset + local_42c;
      if ((-(float)(iVar2 + -1) * 10.0 + ((fVar18 - 12.5) - 5.0)) - local_42c <= 12.5) break;
      if (local_438 == OnRender::s_LastActivePage) {
        CTextCursor::MoveTo((CTextCursor *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                            in_stack_fffffffffffffb78);
        pIVar12 = CComponent::TextRender((CComponent *)0x157b6d);
        (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                  (pIVar12,&OnRender::s_Cursor,0,0xffffffff);
      }
      local_428 = TStaticRingBuffer<CGameConsole::CInstance::CBacklogEntry,_65536,_1>::Prev
                            (in_stack_fffffffffffffb80,
                             (CBacklogEntry *)
                             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    if (local_428 == (CBacklogEntry *)0x0) break;
    local_434 = local_434 + 1;
  }
  iVar2 = clamp<int>(pCVar10->m_BacklogActPage,0,local_434 + -1);
  pCVar10->m_BacklogActPage = iVar2;
  OnRender::s_LastActivePage = pCVar10->m_BacklogActPage;
  CTextCursor::Reset((CTextCursor *)in_stack_fffffffffffffb80,
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  OnRender::s_Cursor.m_MaxWidth = -1.0;
  pCVar13 = &local_2d8;
  pcVar14 = Localize((char *)in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  str_format((char *)pCVar13,0x80,pcVar14,(ulong)(pCVar10->m_BacklogActPage + 1));
  CTextCursor::MoveTo(pCVar13,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
  pIVar12 = CComponent::TextRender((CComponent *)0x157ca2);
  (*(pIVar12->super_IInterface)._vptr_IInterface[0xb])
            (pIVar12,&OnRender::s_Cursor,&local_2d8,0xffffffff);
  str_format((char *)&local_2d8,0x80,"v%s","0.7.5");
  CTextCursor::Reset(pCVar13,CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  CTextCursor::MoveTo(pCVar13,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
  OnRender::s_Cursor.m_Align = 2;
  pIVar12 = CComponent::TextRender((CComponent *)0x157d2c);
  (*(pIVar12->super_IInterface)._vptr_IInterface[0xb])
            (pIVar12,&OnRender::s_Cursor,&local_2d8,0xffffffff);
  OnRender::s_Cursor.m_Align = 0;
LAB_00157d53:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::OnRender()
{
	CUIRect Screen = *UI()->Screen();
	float ConsoleMaxHeight = Screen.h*3/5.0f;
	float ConsoleHeight;

	const float Now = TimeNow();
	float Progress = (Now - (m_StateChangeEnd - m_StateChangeDuration)) / float(m_StateChangeDuration);

	if(Progress >= 1.0f)
	{
		if(m_ConsoleState == CONSOLE_CLOSING)
		{
			m_ConsoleState = CONSOLE_CLOSED;
			CurrentConsole()->m_Input.Deactivate();
		}
		else if(m_ConsoleState == CONSOLE_OPENING)
		{
			m_ConsoleState = CONSOLE_OPEN;
			CurrentConsole()->m_Input.Activate(CONSOLE);
		}

		Progress = 1.0f;
	}

	if(m_ConsoleState == CONSOLE_OPEN && Config()->m_ClEditor)
		Toggle(CONSOLETYPE_LOCAL);

	if(m_ConsoleState == CONSOLE_CLOSED)
		return;

	if(m_ConsoleState == CONSOLE_OPEN)
		Input()->MouseModeAbsolute();

	float ConsoleHeightScale;

	if(m_ConsoleState == CONSOLE_OPENING)
		ConsoleHeightScale = ConsoleScaleFunc(Progress);
	else if(m_ConsoleState == CONSOLE_CLOSING)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f-Progress);
	else //if(console_state == CONSOLE_OPEN)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f);

	ConsoleHeight = ConsoleHeightScale*ConsoleMaxHeight;

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	// do console shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	IGraphics::CColorVertex Array[4] = {
		IGraphics::CColorVertex(0, 0,0,0, 0.5f),
		IGraphics::CColorVertex(1, 0,0,0, 0.5f),
		IGraphics::CColorVertex(2, 0,0,0, 0.0f),
		IGraphics::CColorVertex(3, 0,0,0, 0.0f)};
	Graphics()->SetColorVertex(Array, 4);
	IGraphics::CQuadItem QuadItem(0, ConsoleHeight, Screen.w, 10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do background
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BG].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0.2f, 0.2f, 0.2f,0.9f);
	if(m_ConsoleType == CONSOLETYPE_REMOTE)
		Graphics()->SetColor(0.4f, 0.2f, 0.2f,0.9f);
	Graphics()->QuadsSetSubset(0,-ConsoleHeight*0.075f,Screen.w*0.075f*0.5f,0);
	QuadItem = IGraphics::CQuadItem(0, 0, Screen.w, ConsoleHeight);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do small bar shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Array[0] = IGraphics::CColorVertex(0, 0,0,0, 0.0f);
	Array[1] = IGraphics::CColorVertex(1, 0,0,0, 0.0f);
	Array[2] = IGraphics::CColorVertex(2, 0,0,0, 0.25f);
	Array[3] = IGraphics::CColorVertex(3, 0,0,0, 0.25f);
	Graphics()->SetColorVertex(Array, 4);
	QuadItem = IGraphics::CQuadItem(0, ConsoleHeight-20, Screen.w, 10);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do the lower bar
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BAR].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 0.9f);
	Graphics()->QuadsSetSubset(0,0.1f,Screen.w*0.015f,1-0.1f);
	QuadItem = IGraphics::CQuadItem(0,ConsoleHeight-10.0f,Screen.w,10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	ConsoleHeight -= 22.0f;

	CInstance *pConsole = CurrentConsole();

	{
		float FontSize = 10.0f;
		float RowHeight = FontSize*1.25f;
		float x = 3;
		float y = ConsoleHeight - RowHeight - 5.0f;

		static CTextCursor s_InfoCursor;
		s_InfoCursor.Reset();
		s_InfoCursor.MoveTo(x+pConsole->m_CompletionRenderOffset, y+RowHeight+2.0f);
		s_InfoCursor.m_FontSize = FontSize;
		s_InfoCursor.m_MaxWidth = -1.0f;

		// render prompt
		static CTextCursor s_PromptCursor(FontSize);
		s_PromptCursor.MoveTo(x, y);
		const char *pPrompt = "> ";
		if(m_ConsoleType == CONSOLETYPE_REMOTE)
		{
			if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING)
			{
				if(Client()->RconAuthed())
					pPrompt = "rcon> ";
				else
					pPrompt = "ENTER PASSWORD> ";
			}
			else
				pPrompt = "NOT CONNECTED> ";
		}
		s_PromptCursor.Reset((int64)pPrompt);
		TextRender()->TextOutlined(&s_PromptCursor, pPrompt, -1);

		x = s_PromptCursor.AdvancePosition().x;

		// render console input (wrap line)
		pConsole->m_Input.SetHidden(m_ConsoleType == CONSOLETYPE_REMOTE && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING) && !Client()->RconAuthed());
		CTextCursor *pInputCursor = pConsole->m_Input.GetCursor();
		pInputCursor->m_Align = TEXTALIGN_BL;
		pInputCursor->m_MaxLines = -1;
		pInputCursor->m_FontSize = FontSize;
		pInputCursor->m_MaxWidth = Screen.w - 10.0f - x;
		pInputCursor->MoveTo(x, y + FontSize * 1.35f);

		pConsole->m_Input.Activate(CONSOLE); // ensure the input is active
		pConsole->m_Input.Render();

		y -= (pInputCursor->LineCount() - 1) * FontSize;

		// render possible commands
		static float s_LastRender = Now;
		if((m_ConsoleType == CONSOLETYPE_LOCAL || Client()->RconAuthed()) && pConsole->m_Input.GetString()[0])
		{
			CCompletionOptionRenderInfo Info;
			Info.m_pSelf = this;
			Info.m_WantedCompletion = pConsole->m_CompletionChosen;
			Info.m_EnumCount = 0;
			Info.m_Offset = pConsole->m_CompletionRenderOffset;
			Info.m_pOffsetChange = &pConsole->m_CompletionRenderOffsetChange;
			Info.m_Width = Screen.w;
			Info.m_TotalWidth = 0.0f;
			Info.m_pCurrentCmd = pConsole->m_aCompletionBuffer;
			Info.m_pCursor = &s_InfoCursor;
			m_pConsole->PossibleCommands(Info.m_pCurrentCmd, pConsole->m_CompletionFlagmask, m_ConsoleType != CGameConsole::CONSOLETYPE_LOCAL &&
				Client()->RconAuthed() && Client()->UseTempRconCommands(), PossibleCommandsRenderCallback, &Info);

			if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
			{
				if(IsMapCommandPrefix(Info.m_pCurrentCmd))
				{
					Info.m_WantedCompletion = pConsole->m_CompletionMapChosen;
					Info.m_EnumCount = 0;
					Info.m_TotalWidth = 0.0f;
					Info.m_pCurrentCmd = pConsole->m_aCompletionMapBuffer;
					m_pConsole->PossibleMaps(Info.m_pCurrentCmd, PossibleCommandsRenderCallback, &Info);
				}

				if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
				{
					char aBuf[512];
					str_format(aBuf, sizeof(aBuf), "Help: %s ", pConsole->m_aCommandHelp);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
					TextRender()->TextColor(0.75f, 0.75f, 0.75f, 1);
					str_format(aBuf, sizeof(aBuf), "Syntax: %s %s", pConsole->m_aCommandName, pConsole->m_aCommandParams);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
				}
			}

			// instant scrolling if distance too long
			if(absolute(pConsole->m_CompletionRenderOffsetChange) > Info.m_Width)
			{
				pConsole->m_CompletionRenderOffset += pConsole->m_CompletionRenderOffsetChange;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// smooth scrolling
			if(pConsole->m_CompletionRenderOffsetChange)
			{
				const float Delta = pConsole->m_CompletionRenderOffsetChange * clamp((Now - s_LastRender) * 10.0f, 0.0f, 1.0f);
				pConsole->m_CompletionRenderOffset += Delta;
				pConsole->m_CompletionRenderOffsetChange -= Delta;
			}
			// clamp to first item
			if(pConsole->m_CompletionRenderOffset > 0.0f)
			{
				pConsole->m_CompletionRenderOffset = 0.0f;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// clamp to last item
			if(Info.m_TotalWidth > Info.m_Width && pConsole->m_CompletionRenderOffset < Info.m_Width - Info.m_TotalWidth)
			{
				pConsole->m_CompletionRenderOffset = Info.m_Width - Info.m_TotalWidth;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
		}
		s_LastRender = Now;

		TextRender()->DrawTextOutlined(&s_InfoCursor);

		TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

		// render log (actual page, wrap lines)
		static CTextCursor s_Cursor;
		s_Cursor.Reset();
		s_Cursor.MoveTo(x, y);
		s_Cursor.m_FontSize = FontSize;
		s_Cursor.m_MaxLines = -1;
		s_Cursor.m_MaxWidth = Screen.w - 10.0f;

		CInstance::CBacklogEntry *pEntry = pConsole->m_Backlog.Last();
		float OffsetY = 0.0f;
		const float LineOffset = 1.0f;
		static int s_LastActivePage = pConsole->m_BacklogActPage;
		int TotalPages = 1;
		for(int Page = 0; Page <= s_LastActivePage; ++Page, OffsetY = 0.0f)
		{
			while(pEntry)
			{
				s_Cursor.Reset();
				if(pEntry->m_Highlighted)
					TextRender()->TextColor(1.0f, 0.75f, 0.75f, 1.0f);
				TextRender()->TextDeferred(&s_Cursor, pEntry->m_aText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

				// get y offset (calculate it if we haven't yet)
				if(pEntry->m_YOffset < 0.0f)
					pEntry->m_YOffset = s_Cursor.BaseLineY() + LineOffset;
				OffsetY += pEntry->m_YOffset;

				// next page when lines reach the top
				if(y - OffsetY <= RowHeight)
					break;

				// just render output from actual backlog page (render bottom up)
				if(Page == s_LastActivePage)
				{
					s_Cursor.MoveTo(0.0f, y - OffsetY);
					TextRender()->DrawTextOutlined(&s_Cursor);
				}

				pEntry = pConsole->m_Backlog.Prev(pEntry);
			}
			if(!pEntry)
				break;
			TotalPages++;
		}
		pConsole->m_BacklogActPage = clamp(pConsole->m_BacklogActPage, 0, TotalPages - 1);
		s_LastActivePage = pConsole->m_BacklogActPage;

		s_Cursor.Reset();
		s_Cursor.m_MaxWidth = -1;
		// render page
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), Localize("-Page %d-"), pConsole->m_BacklogActPage+1);
		s_Cursor.MoveTo(10.0f, 0.0f);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);

		// render version
		str_format(aBuf, sizeof(aBuf), "v%s", GAME_RELEASE_VERSION);
		s_Cursor.Reset();
		s_Cursor.MoveTo(Screen.w-10.0f, 0.0f);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);
		s_Cursor.m_Align = TEXTALIGN_LEFT;
	}
}